

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,StringRef text,XmlFormatting fmt)

{
  bool bVar1;
  string local_58;
  ReusableStringStream local_38;
  
  if ((this->m_tags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_tags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (text.m_size != 0) {
      bVar1 = this->m_tagIsOpen;
      ensureTagClosed(this);
      if (((fmt & Indent) != None) && (bVar1 != false)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
      }
      local_58.field_2._M_allocated_capacity._0_4_ = 0;
      local_58._M_dataplus._M_p = text.m_start;
      local_58._M_string_length = text.m_size;
      XmlEncode::encodeTo((XmlEncode *)&local_58,this->m_os);
      this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
    }
    return this;
  }
  ReusableStringStream::ReusableStringStream(&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_38.m_oss,"Cannot write text as top level element",0x26);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_58);
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }